

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

ExactFloat
util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Dot<0ul,1ul,2ul>
          (ExactFloat *sum,ExactFloat *a,ExactFloat *b)

{
  BigNum extraout_RDX;
  ExactFloat EVar1;
  ExactFloat EStack_58;
  ExactFloat local_48;
  ExactFloat local_38;
  
  operator*(&local_38,b);
  ExactFloat::operator+=(a,&local_38);
  operator*(&local_48,b + 1);
  ExactFloat::operator+=(a,&local_48);
  operator*(&EStack_58,b + 2);
  ExactFloat::operator+=(a,&EStack_58);
  BN_free((BIGNUM *)EStack_58.bn_.bn_);
  BN_free((BIGNUM *)local_48.bn_.bn_);
  BN_free((BIGNUM *)local_38.bn_.bn_);
  ExactFloat::ExactFloat(sum,a);
  EVar1.bn_.bn_ = extraout_RDX.bn_;
  EVar1._0_8_ = sum;
  return EVar1;
}

Assistant:

static T Dot(T sum, const T* a, const T* b, absl::index_sequence<Is...>) {
    Ignore({(sum += a[Is] * b[Is], true)...});
    return sum;
  }